

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O1

void __thiscall
QEvdevTabletHandlerThread::~QEvdevTabletHandlerThread(QEvdevTabletHandlerThread *this)

{
  Data *pDVar1;
  QDeadlineTimer QVar2;
  
  *(undefined ***)this = &PTR_metaObject_0010e668;
  QThread::quit();
  QVar2.t2 = 0xffffffff;
  QVar2.type = 0x7fffffff;
  QVar2.t1 = (qint64)this;
  QThread::wait(QVar2);
  pDVar1 = (this->m_spec).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_spec).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->m_device).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_device).d.d)->super_QArrayData,2,0x10);
    }
  }
  QDaemonThread::~QDaemonThread(&this->super_QDaemonThread);
  return;
}

Assistant:

QEvdevTabletHandlerThread::~QEvdevTabletHandlerThread()
{
    quit();
    wait();
}